

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwtran.c
# Opt level: O1

void png_do_write_transformations(png_structrp png_ptr,png_row_infop row_info)

{
  uint *puVar1;
  png_byte pVar2;
  undefined2 uVar3;
  png_uint_32 pVar4;
  size_t sVar5;
  byte bVar6;
  int iVar7;
  png_bytep ppVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  png_byte pVar13;
  uint uVar14;
  png_bytep ppVar15;
  ushort *puVar16;
  long lVar17;
  png_uint_32 istop;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ushort uVar21;
  uint uVar22;
  size_t sVar23;
  bool bVar24;
  int shift_start [4];
  uint local_68 [4];
  int local_58 [5];
  int local_44;
  png_structrp local_40;
  png_row_infop local_38;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if (((png_ptr->transformations & 0x100000) != 0) &&
     (png_ptr->write_user_transform_fn != (png_user_transform_ptr)0x0)) {
    (*png_ptr->write_user_transform_fn)(png_ptr,row_info,png_ptr->row_buf + 1);
  }
  if ((png_ptr->transformations & 0x8000) != 0) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,(uint)(-1 < (char)png_ptr->flags));
  }
  if ((png_ptr->transformations & 0x10000) != 0) {
    png_do_packswap(row_info,png_ptr->row_buf + 1);
  }
  if ((((png_ptr->transformations & 4) == 0) || (row_info->bit_depth != '\b')) ||
     (row_info->channels != '\x01')) goto LAB_00124a8b;
  ppVar8 = png_ptr->row_buf + 1;
  pVar2 = png_ptr->bit_depth;
  ppVar15 = ppVar8;
  if (pVar2 == '\x04') {
    pVar4 = row_info->width;
    uVar10 = 0;
    if (pVar4 == 0) {
LAB_00124a46:
      pVar13 = '\0';
      bVar24 = true;
    }
    else {
      iVar7 = 4;
      lVar17 = 0;
      do {
        uVar10 = (ppVar8[lVar17] & 0xf) << ((byte)iVar7 & 0x1f) | uVar10;
        if (iVar7 == 0) {
          *ppVar15 = (png_byte)uVar10;
          ppVar15 = ppVar15 + 1;
          uVar10 = 0;
          iVar7 = 4;
        }
        else {
          iVar7 = iVar7 + -4;
        }
        pVar13 = (png_byte)uVar10;
        lVar17 = lVar17 + 1;
      } while (pVar4 != (png_uint_32)lVar17);
      bVar24 = iVar7 == 4;
    }
LAB_00124a48:
    if (!bVar24) {
      *ppVar15 = pVar13;
    }
  }
  else {
    if (pVar2 == '\x02') {
      pVar4 = row_info->width;
      uVar10 = 0;
      if (pVar4 == 0) goto LAB_00124a46;
      iVar7 = 6;
      lVar17 = 0;
      do {
        uVar10 = (ppVar8[lVar17] & 3) << ((byte)iVar7 & 0x1f) | uVar10;
        if (iVar7 == 0) {
          *ppVar15 = (png_byte)uVar10;
          ppVar15 = ppVar15 + 1;
          uVar10 = 0;
          iVar7 = 6;
        }
        else {
          iVar7 = iVar7 + -2;
        }
        pVar13 = (png_byte)uVar10;
        lVar17 = lVar17 + 1;
      } while (pVar4 != (png_uint_32)lVar17);
      bVar24 = iVar7 == 6;
      goto LAB_00124a48;
    }
    if (pVar2 == '\x01') {
      pVar4 = row_info->width;
      uVar10 = 0;
      pVar13 = '\0';
      if (pVar4 == 0) {
        bVar24 = true;
      }
      else {
        uVar18 = 0x80;
        lVar17 = 0;
        do {
          uVar14 = 0;
          if (ppVar8[lVar17] != '\0') {
            uVar14 = uVar18;
          }
          uVar10 = uVar10 | uVar14;
          if (uVar18 < 2) {
            *ppVar15 = (png_byte)uVar10;
            ppVar15 = ppVar15 + 1;
            uVar18 = 0x80;
            uVar10 = 0;
          }
          else {
            uVar18 = uVar18 >> 1;
          }
          pVar13 = (png_byte)uVar10;
          lVar17 = lVar17 + 1;
        } while (pVar4 != (png_uint_32)lVar17);
        bVar24 = uVar18 == 0x80;
        ppVar8 = ppVar15;
      }
      if (!bVar24) {
        *ppVar8 = pVar13;
      }
    }
  }
  row_info->bit_depth = pVar2;
  bVar6 = row_info->channels * pVar2;
  row_info->pixel_depth = bVar6;
  if (bVar6 < 8) {
    uVar11 = (ulong)row_info->width * (ulong)bVar6 + 7 >> 3;
  }
  else {
    uVar11 = (ulong)row_info->width * (ulong)(bVar6 >> 3);
  }
  row_info->rowbytes = uVar11;
LAB_00124a8b:
  if ((png_ptr->transformations & 0x10) != 0) {
    png_do_swap(row_info,png_ptr->row_buf + 1);
  }
  if (((png_ptr->transformations & 8) != 0) && (bVar6 = row_info->color_type, bVar6 != 3)) {
    uVar10 = (uint)row_info->bit_depth;
    if ((bVar6 & 2) == 0) {
      local_68[0] = (uint)(png_ptr->shift).gray;
      local_58[0] = uVar10 - local_68[0];
      uVar10 = 1;
    }
    else {
      local_68[0] = (uint)(png_ptr->shift).red;
      local_58[0] = uVar10 - local_68[0];
      local_68[1] = (uint)(png_ptr->shift).green;
      local_58[1] = uVar10 - local_68[1];
      local_68[2] = (uint)(png_ptr->shift).blue;
      local_58[2] = uVar10 - local_68[2];
      uVar10 = 3;
    }
    ppVar8 = png_ptr->row_buf;
    if ((bVar6 & 4) != 0) {
      uVar18 = (uint)(png_ptr->shift).alpha;
      *(uint *)((long)local_58 + (ulong)(uVar10 * 4)) = row_info->bit_depth - uVar18;
      *(uint *)((long)local_68 + (ulong)(uVar10 * 4)) = uVar18;
      uVar10 = uVar10 + 1;
    }
    puVar16 = (ushort *)(ppVar8 + 1);
    bVar6 = row_info->bit_depth;
    local_38 = row_info;
    local_40 = png_ptr;
    if (bVar6 < 8) {
      sVar5 = row_info->rowbytes;
      pVar2 = (png_ptr->shift).gray;
      uVar10 = 0xff;
      if (pVar2 == '\x03' && bVar6 == 4) {
        uVar10 = 0x11;
      }
      uVar18 = 0x55;
      if (bVar6 != 2 || pVar2 != '\x01') {
        uVar18 = uVar10;
      }
      if (sVar5 != 0) {
        local_44 = -local_58[0];
        sVar23 = 0;
        do {
          uVar10 = 0;
          bVar6 = 0;
          if (local_58[0] != -local_68[0] &&
              SBORROW4(local_58[0],-local_68[0]) == (int)(local_58[0] + local_68[0]) < 0) {
            iVar7 = local_44;
            iVar19 = local_58[0];
            do {
              uVar14 = (byte)((byte)*puVar16 >> ((byte)iVar7 & 0x1f)) & uVar18;
              if (0 < iVar19) {
                uVar14 = (uint)(byte)*puVar16 << ((byte)iVar19 & 0x1f);
              }
              uVar10 = uVar10 | uVar14;
              bVar6 = (byte)uVar10;
              iVar7 = iVar7 + local_68[0];
              bVar24 = 0 < iVar19;
              iVar19 = iVar19 - local_68[0];
            } while (bVar24);
          }
          *(byte *)puVar16 = bVar6;
          sVar23 = sVar23 + 1;
          puVar16 = (ushort *)((long)puVar16 + 1);
        } while (sVar23 != sVar5);
      }
    }
    else {
      uVar18 = row_info->width * uVar10;
      if (bVar6 == 8) {
        if (uVar18 != 0) {
          uVar14 = 0;
          do {
            uVar20 = 0;
            bVar6 = 0;
            uVar11 = (ulong)(uVar14 % uVar10 << 2);
            iVar7 = *(int *)((long)local_58 + uVar11);
            iVar19 = *(int *)((long)local_68 + uVar11);
            if (iVar7 != -iVar19 && SBORROW4(iVar7,-iVar19) == iVar7 + iVar19 < 0) {
              iVar12 = -iVar7;
              do {
                uVar22 = (uint)(byte)((byte)*puVar16 >> ((byte)iVar12 & 0x1f));
                if (0 < iVar7) {
                  uVar22 = (uint)(byte)*puVar16 << ((byte)iVar7 & 0x1f);
                }
                uVar20 = uVar20 | uVar22;
                bVar6 = (byte)uVar20;
                iVar12 = iVar12 + iVar19;
                bVar24 = 0 < iVar7;
                iVar7 = iVar7 - iVar19;
              } while (bVar24);
            }
            *(byte *)puVar16 = bVar6;
            uVar14 = uVar14 + 1;
            puVar16 = (ushort *)((long)puVar16 + 1);
          } while (uVar14 != uVar18);
        }
      }
      else if (uVar18 != 0) {
        uVar14 = 0;
        do {
          uVar11 = (ulong)(uVar14 % uVar10 << 2);
          iVar7 = *(int *)((long)local_58 + uVar11);
          iVar19 = *(int *)((long)local_68 + uVar11);
          uVar21 = 0;
          if (iVar7 != -iVar19 && SBORROW4(iVar7,-iVar19) == iVar7 + iVar19 < 0) {
            uVar9 = *puVar16 << 8 | *puVar16 >> 8;
            iVar12 = -iVar7;
            uVar20 = 0;
            do {
              uVar22 = (uint)(uVar9 >> ((byte)iVar12 & 0x1f));
              if (0 < iVar7) {
                uVar22 = (uint)uVar9 << ((byte)iVar7 & 0x1f);
              }
              uVar20 = uVar20 | uVar22;
              uVar21 = (ushort)uVar20;
              iVar12 = iVar12 + iVar19;
              bVar24 = 0 < iVar7;
              iVar7 = iVar7 - iVar19;
            } while (bVar24);
          }
          *puVar16 = uVar21 << 8 | uVar21 >> 8;
          puVar16 = puVar16 + 1;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar18);
      }
    }
  }
  if ((png_ptr->transformations & 0x20000) != 0) {
    ppVar8 = png_ptr->row_buf;
    if (row_info->color_type == '\x04') {
      pVar4 = row_info->width;
      if (row_info->bit_depth == '\b') {
        if (pVar4 != 0) {
          lVar17 = 0;
          do {
            puVar16 = (ushort *)(ppVar8 + lVar17 * 2 + 1);
            *puVar16 = *puVar16 << 8 | *puVar16 >> 8;
            lVar17 = lVar17 + 1;
          } while (pVar4 != (png_uint_32)lVar17);
        }
      }
      else if (pVar4 != 0) {
        lVar17 = 0;
        do {
          puVar1 = (uint *)(ppVar8 + lVar17 * 4 + 1);
          *puVar1 = *puVar1 << 0x10 | *puVar1 >> 0x10;
          lVar17 = lVar17 + 1;
        } while (pVar4 != (png_uint_32)lVar17);
      }
    }
    else if (row_info->color_type == '\x06') {
      pVar4 = row_info->width;
      if (row_info->bit_depth == '\b') {
        if (pVar4 != 0) {
          lVar17 = 0;
          do {
            pVar2 = ppVar8[lVar17 * 4 + 1];
            ppVar8[lVar17 * 4 + 1] = ppVar8[lVar17 * 4 + 2];
            *(undefined2 *)(ppVar8 + lVar17 * 4 + 2) = *(undefined2 *)(ppVar8 + lVar17 * 4 + 3);
            ppVar8[lVar17 * 4 + 4] = pVar2;
            lVar17 = lVar17 + 1;
          } while (pVar4 != (png_uint_32)lVar17);
        }
      }
      else if (pVar4 != 0) {
        lVar17 = 0;
        do {
          uVar3 = *(undefined2 *)(ppVar8 + lVar17 * 8 + 1);
          ppVar8[lVar17 * 8 + 1] = ppVar8[lVar17 * 8 + 3];
          *(undefined2 *)(ppVar8 + lVar17 * 8 + 2) = *(undefined2 *)(ppVar8 + lVar17 * 8 + 4);
          ppVar8[lVar17 * 8 + 4] = ppVar8[lVar17 * 8 + 6];
          *(undefined2 *)(ppVar8 + lVar17 * 8 + 5) = *(undefined2 *)(ppVar8 + lVar17 * 8 + 7);
          *(undefined2 *)(ppVar8 + lVar17 * 8 + 7) = uVar3;
          lVar17 = lVar17 + 1;
        } while (pVar4 != (png_uint_32)lVar17);
      }
    }
  }
  if ((png_ptr->transformations & 0x80000) != 0) {
    ppVar8 = png_ptr->row_buf;
    if (row_info->color_type == '\x04') {
      pVar4 = row_info->width;
      if (row_info->bit_depth == '\b') {
        if (pVar4 != 0) {
          lVar17 = 0;
          do {
            ppVar8[lVar17 * 2 + 2] = ~ppVar8[lVar17 * 2 + 2];
            lVar17 = lVar17 + 1;
          } while (pVar4 != (png_uint_32)lVar17);
        }
      }
      else if (pVar4 != 0) {
        lVar17 = 0;
        do {
          ppVar8[lVar17 * 4 + 3] = ~ppVar8[lVar17 * 4 + 3];
          ppVar8[lVar17 * 4 + 4] = ~ppVar8[lVar17 * 4 + 4];
          lVar17 = lVar17 + 1;
        } while (pVar4 != (png_uint_32)lVar17);
      }
    }
    else if (row_info->color_type == '\x06') {
      pVar4 = row_info->width;
      if (row_info->bit_depth == '\b') {
        if (pVar4 != 0) {
          lVar17 = 0;
          do {
            ppVar8[lVar17 * 4 + 4] = ~ppVar8[lVar17 * 4 + 4];
            lVar17 = lVar17 + 1;
          } while (pVar4 != (png_uint_32)lVar17);
        }
      }
      else if (pVar4 != 0) {
        lVar17 = 0;
        do {
          ppVar8[lVar17 * 8 + 7] = ~ppVar8[lVar17 * 8 + 7];
          ppVar8[lVar17 * 8 + 8] = ~ppVar8[lVar17 * 8 + 8];
          lVar17 = lVar17 + 1;
        } while (pVar4 != (png_uint_32)lVar17);
      }
    }
  }
  if ((png_ptr->transformations & 1) != 0) {
    png_do_bgr(row_info,png_ptr->row_buf + 1);
  }
  if ((png_ptr->transformations & 0x20) == 0) {
    return;
  }
  png_do_invert(row_info,png_ptr->row_buf + 1);
  return;
}

Assistant:

void /* PRIVATE */
png_do_write_transformations(png_structrp png_ptr, png_row_infop row_info)
{
   png_debug(1, "in png_do_write_transformations");

   if (png_ptr == NULL)
      return;

#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
   if ((png_ptr->transformations & PNG_USER_TRANSFORM) != 0)
      if (png_ptr->write_user_transform_fn != NULL)
         (*(png_ptr->write_user_transform_fn)) /* User write transform
                                                 function */
             (png_ptr,  /* png_ptr */
             row_info,  /* row_info: */
                /*  png_uint_32 width;       width of row */
                /*  size_t rowbytes;         number of bytes in row */
                /*  png_byte color_type;     color type of pixels */
                /*  png_byte bit_depth;      bit depth of samples */
                /*  png_byte channels;       number of channels (1-4) */
                /*  png_byte pixel_depth;    bits per pixel (depth*channels) */
             png_ptr->row_buf + 1);      /* start of pixel data for row */
#endif

#ifdef PNG_WRITE_FILLER_SUPPORTED
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          !(png_ptr->flags & PNG_FLAG_FILLER_AFTER));
#endif

#ifdef PNG_WRITE_PACKSWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_do_packswap(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_PACK_SUPPORTED
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_do_pack(row_info, png_ptr->row_buf + 1,
          (png_uint_32)png_ptr->bit_depth);
#endif

#ifdef PNG_WRITE_SWAP_SUPPORTED
#  ifdef PNG_16BIT_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_do_swap(row_info, png_ptr->row_buf + 1);
#  endif
#endif

#ifdef PNG_WRITE_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_do_shift(row_info, png_ptr->row_buf + 1,
           &(png_ptr->shift));
#endif

#ifdef PNG_WRITE_SWAP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_ALPHA) != 0)
      png_do_write_swap_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_INVERT_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0)
      png_do_write_invert_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_BGR_SUPPORTED
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_do_bgr(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_INVERT_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_do_invert(row_info, png_ptr->row_buf + 1);
#endif
}